

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::MultisampleCase::randomizeViewport(MultisampleCase *this)

{
  int iVar1;
  GLenum err;
  RenderTarget *pRVar2;
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = de::Random::getInt(&this->m_rnd,0,pRVar2->m_width - this->m_viewportSize);
  this->m_viewportX = iVar1;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = de::Random::getInt(&this->m_rnd,0,pRVar2->m_height - this->m_viewportSize);
  this->m_viewportY = iVar1;
  glwViewport(this->m_viewportX,iVar1,this->m_viewportSize,this->m_viewportSize);
  err = glwGetError();
  glu::checkError(err,"glViewport(m_viewportX, m_viewportY, m_viewportSize, m_viewportSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x136);
  return;
}

Assistant:

void MultisampleCase::randomizeViewport (void)
{
	m_viewportX = m_rnd.getInt(0, m_context.getRenderTarget().getWidth() - m_viewportSize);
	m_viewportY = m_rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportSize);

	GLU_CHECK_CALL(glViewport(m_viewportX, m_viewportY, m_viewportSize, m_viewportSize));
}